

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VDetector.cpp
# Opt level: O3

void __thiscall VDetector::VDetector(VDetector *this)

{
  this->_vptr_VDetector = (_func_int **)&PTR__VDetector_00119d28;
  this->g1 = 0.076;
  this->sPEres = 0.58;
  this->sPEthr = 0.35;
  this->sPEeff = 1.0;
  this->noiseBaseline[0] = 0.0;
  this->noiseBaseline[1] = 0.0;
  this->noiseBaseline[2] = 0.0;
  this->noiseBaseline[3] = 0.0;
  this->P_dphe = 0.2;
  this->coinWind = 100.0;
  this->coinLevel = 2;
  this->numPMTs = 0x59;
  this->OldW13eV = true;
  this->noiseLinear[0] = 0.03;
  this->noiseLinear[1] = 0.03;
  this->noiseQuadratic[0] = 0.0;
  this->noiseQuadratic[1] = 0.0;
  this->g1_gas = 0.06;
  this->s2Fano = 3.61;
  this->s2_thr = 300.0;
  this->E_gas = 12.0;
  this->eLife_us = 2200.0;
  this->inGas = false;
  this->T_Kelvin = 177.0;
  this->p_bar = 2.14;
  this->dtCntr = 40.0;
  this->dt_min = 20.0;
  this->dt_max = 60.0;
  this->radius = 50.0;
  this->radmax = 50.0;
  this->TopDrift = 150.0;
  this->anode = 152.5;
  this->gate = 147.5;
  this->cathode = 1.0;
  this->PosResExp = 0.015;
  this->PosResBase = 70.8364;
  this->molarMass = 131.293;
  return;
}

Assistant:

VDetector::VDetector() { Initialization(); }